

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O0

void ibuf_shrink(ibuf *ibuf)

{
  slab_cache *psVar1;
  slab *psVar2;
  size_t sVar3;
  size_t sVar4;
  slab *slab_00;
  char *__dest;
  slab *slab_01;
  char *ptr;
  slab *slab;
  size_t new_capacity;
  size_t capacity;
  size_t used;
  ibuf *ibuf_local;
  
  psVar2 = (slab *)ibuf_used(ibuf);
  if (psVar2 == (slab *)0x0) {
    if (ibuf->buf != (char *)0x0) {
      psVar1 = ibuf->slabc;
      psVar2 = slab_from_data(ibuf->buf);
      slab_put(psVar1,psVar2);
    }
    ibuf->end = (char *)0x0;
    ibuf->wpos = (char *)0x0;
    ibuf->rpos = (char *)0x0;
    ibuf->buf = (char *)0x0;
  }
  else {
    sVar3 = ibuf_capacity(ibuf);
    slab = (slab *)ibuf->start_capacity;
    if ((slab *)ibuf->start_capacity < psVar2) {
      slab = psVar2;
    }
    sVar3 = slab_real_size(ibuf->slabc,sVar3);
    sVar4 = slab_real_size(ibuf->slabc,(size_t)slab);
    if ((sVar3 != sVar4) && (slab_00 = slab_get(ibuf->slabc,(size_t)slab), slab_00 != (slab *)0x0))
    {
      __dest = (char *)slab_data(slab_00);
      memcpy(__dest,ibuf->rpos,(size_t)psVar2);
      if (ibuf->buf != (char *)0x0) {
        psVar1 = ibuf->slabc;
        slab_01 = slab_from_data(ibuf->buf);
        slab_put(psVar1,slab_01);
      }
      ibuf->buf = __dest;
      ibuf->rpos = __dest;
      ibuf->wpos = __dest + (long)psVar2;
      sVar3 = slab_capacity(slab_00);
      ibuf->end = __dest + sVar3;
      ibuf_poison_unallocated(ibuf);
    }
  }
  return;
}

Assistant:

void
ibuf_shrink(struct ibuf *ibuf)
{
	size_t used = ibuf_used(ibuf);
	if (used == 0) {
		if (ibuf->buf)
			slab_put(ibuf->slabc, slab_from_data(ibuf->buf));
		ibuf->buf = ibuf->rpos = ibuf->wpos = ibuf->end = NULL;
		return;
	}

	size_t capacity = ibuf_capacity(ibuf);
	size_t new_capacity = ibuf->start_capacity;
	if (new_capacity < used)
		new_capacity = used;

	/* Avoid relocation if the actual slab size doesn't change. */
	if (slab_real_size(ibuf->slabc, capacity) ==
	    slab_real_size(ibuf->slabc, new_capacity))
		return;

	struct slab *slab = slab_get(ibuf->slabc, new_capacity);
	if (slab == NULL)
		return;

	char *ptr = (char *)slab_data(slab);
	memcpy(ptr, ibuf->rpos, used);
	if (ibuf->buf)
		slab_put(ibuf->slabc, slab_from_data(ibuf->buf));
	ibuf->buf = ptr;
	ibuf->rpos = ptr;
	ibuf->wpos = ptr + used;
	ibuf->end = ptr + slab_capacity(slab);
	ibuf_poison_unallocated(ibuf);
}